

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_>::size
          (Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *e;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *this_00;
  
  ensureStringifiedInitialized(this);
  this_00 = (this->stringified).ptr;
  bVar3 = true;
  sVar2 = 0;
  for (lVar4 = (this->stringified).size_ * 0x38; lVar4 != 0; lVar4 = lVar4 + -0x38) {
    lVar5 = 0;
    if (!bVar3) {
      lVar5 = (this->delimiter).content.size_ - 1;
    }
    sVar1 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size(this_00);
    sVar2 = sVar1 + sVar2 + lVar5;
    this_00 = this_00 + 1;
    bVar3 = false;
  }
  return sVar2;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }